

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetree.c
# Opt level: O1

Filetree filetree_init(char **roots,size_t roots_size,gboolean recursive,gboolean follow_symlinks,
                      gboolean no_sort,GSList **errors)

{
  int iVar1;
  Filetree pvVar2;
  GDir *current_dir;
  GSList *pGVar3;
  filename_representations *pfVar4;
  undefined8 uVar5;
  GTree *current_tree;
  size_t sVar6;
  code *pcVar7;
  GError *err;
  long local_50;
  gboolean local_44;
  GSList **local_40;
  filename_representations *local_38;
  
  pcVar7 = compare_insert_last;
  if (no_sort == 0) {
    pcVar7 = compare_filenames;
  }
  local_44 = recursive;
  pvVar2 = (Filetree)g_tree_new_full(pcVar7,0,filename_representations_free,filetree_destroy);
  if (roots_size != 0) {
    sVar6 = 0;
    local_40 = errors;
    do {
      if ((follow_symlinks != 0) || (iVar1 = g_file_test(roots[sVar6],2), iVar1 == 0)) {
        iVar1 = g_file_test(roots[sVar6],4);
        if (iVar1 == 0) {
          iVar1 = g_file_test(roots[sVar6],1);
          if (iVar1 == 0) {
            pGVar3 = *errors;
            uVar5 = g_error_new(1,1,"File \'%s\' not found",roots[sVar6]);
            pGVar3 = (GSList *)g_slist_prepend(pGVar3,uVar5);
            *errors = pGVar3;
          }
          else {
            pfVar4 = filename_representations_new(roots[sVar6],2);
            g_tree_insert(pvVar2,pfVar4,0);
          }
        }
        else if (local_44 == 0) {
          pGVar3 = *errors;
          uVar5 = g_error_new(1,1,"Skipping \'%s\', is a directory",roots[sVar6]);
          pGVar3 = (GSList *)g_slist_prepend(pGVar3,uVar5);
          *errors = pGVar3;
        }
        else {
          local_50 = 0;
          current_dir = (GDir *)g_dir_open(roots[sVar6],0,&local_50);
          if (local_50 == 0) {
            local_38 = filename_representations_new(roots[sVar6],1);
            current_tree = (GTree *)g_tree_new_full(compare_filenames,0,
                                                    filename_representations_free,filetree_destroy);
            g_tree_insert(pvVar2,local_38,current_tree);
            errors = local_40;
            walk_recursive(roots[sVar6],current_dir,current_tree,follow_symlinks,local_40);
            g_dir_close(current_dir);
          }
          else {
            pGVar3 = (GSList *)g_slist_prepend(*errors);
            *errors = pGVar3;
            local_50 = 0;
          }
        }
      }
      sVar6 = sVar6 + 1;
    } while (roots_size != sVar6);
  }
  pGVar3 = (GSList *)g_slist_reverse(*errors);
  *errors = pGVar3;
  return pvVar2;
}

Assistant:

Filetree filetree_init(char *roots[],
                       size_t roots_size,
                       gboolean recursive,
                       gboolean follow_symlinks,
                       gboolean no_sort,
                       GSList **errors)
{
    GTree *root_tree = g_tree_new_full(no_sort ? compare_insert_last
                                               : compare_filenames,
                                       NULL,
                                       filename_representations_free,
                                       filetree_destroy);
    size_t i;

    for (i = 0; i < roots_size; ++i) {
        GTree *sub_dir_tree;
        GDir *dir;
        GError *err;
        struct filename_representations *fr;

        if (!follow_symlinks
            && g_file_test(roots[i], G_FILE_TEST_IS_SYMLINK)) {
            continue;
        }

        if (g_file_test(roots[i], G_FILE_TEST_IS_DIR)) {
            if (!recursive) {
                *errors = g_slist_prepend(*errors, g_error_new(1, 1,
                            "Skipping '%s', is a directory", roots[i]));
                continue;
            }
            err = NULL;
            dir = g_dir_open(roots[i], 0, &err);
            if (err) {
                *errors = g_slist_prepend(*errors, err);
                err = NULL;
                continue;
            }
            fr = filename_representations_new(roots[i], FILETREE_DIR);
            sub_dir_tree = g_tree_new_full(compare_filenames, NULL,
                                           filename_representations_free,
                                           filetree_destroy);

            g_tree_insert(root_tree, fr, sub_dir_tree);
            walk_recursive(roots[i], dir, sub_dir_tree,
                           follow_symlinks, errors);
            g_dir_close(dir);
        } else if (g_file_test(roots[i], G_FILE_TEST_IS_REGULAR)) {
            fr = filename_representations_new(roots[i], FILETREE_FILE);
            g_tree_insert(root_tree, fr, NULL);
        } else {
            *errors = g_slist_prepend(*errors, g_error_new(1, 1,
                        "File '%s' not found", roots[i]));
        }
    }

    *errors = g_slist_reverse(*errors);

    return root_tree;
}